

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O1

void __thiscall TTD::ThreadContextTTD::CleanRecordWeakRootMap(ThreadContextTTD *this)

{
  int iVar1;
  WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *pWVar2;
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  *this_00;
  int i;
  int nextIndex;
  long lVar3;
  int previous;
  int iVar4;
  
  this_00 = Memory::
            RecyclerRootPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>_>
            ::operator->(&this->m_ttdRecordRootWeakMap);
  if (0 < this_00->size) {
    lVar3 = 0;
    do {
      i = (this_00->buckets).ptr[lVar3];
      if (i != -1) {
        previous = -1;
        do {
          pWVar2 = (this_00->entries).ptr;
          iVar1 = pWVar2[i].next;
          iVar4 = i;
          if (((pWVar2[i].key.ptr)->super_RecyclerWeakReferenceBase).strongRef == (Type)0x0) {
            JsUtil::
            WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
            ::RemoveEntry(this_00,i,previous,(uint)lVar3);
            iVar4 = previous;
          }
          i = iVar1;
          previous = iVar4;
        } while (iVar1 != -1);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < this_00->size);
  }
  return;
}

Assistant:

void ThreadContextTTD::CleanRecordWeakRootMap()
    {
        this->m_ttdRecordRootWeakMap->Map([&](Js::RecyclableObject* key, bool, const RecyclerWeakReference<Js::RecyclableObject>*)
        {
            ; //nop just map to force the clean
        });
    }